

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_language.cpp
# Opt level: O3

ReaderTablesPtr __thiscall Omega_h::build_reader_tables(Omega_h *this,Language *language)

{
  int iVar1;
  ParserFail *pPVar2;
  ReaderTables *__p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  byte bVar4;
  long lVar5;
  pointer pTVar6;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  ReaderTablesPtr RVar11;
  GrammarPtr grammar;
  Parser parser;
  FiniteAutomaton lexer;
  uint local_168;
  ulong local_160;
  ParserInProgress local_158;
  GrammarPtr local_e8;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  element_type *local_c8;
  Parser local_c0;
  FiniteAutomaton local_70;
  char *pcVar7;
  
  build_lexer(&local_70,language);
  pTVar6 = (language->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(language->tokens).
                          super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar6) >> 6) < 1) {
    local_160 = 0xffffffff;
    bVar4 = 0;
    local_168 = 0xffffffff;
    uVar8 = 0xffffffff;
  }
  else {
    local_160 = 0xffffffff;
    lVar5 = 0;
    uVar9 = 0;
    local_168 = 0xffffffff;
    bVar4 = 0;
    uVar8 = 0xffffffff;
    local_c8 = (element_type *)this;
    do {
      pcVar7 = (char *)((long)&(pTVar6->name)._M_dataplus + lVar5);
      iVar1 = std::__cxx11::string::compare(pcVar7);
      if (iVar1 == 0) {
        if ((int)uVar8 != -1) {
          pPVar2 = (ParserFail *)__cxa_allocate_exception(0x10);
          local_158.states.
          super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&local_158.states.
                         super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_158,"ERROR: Language has two or more INDENT tokens\n","");
          ParserFail::ParserFail(pPVar2,(string *)&local_158);
          __cxa_throw(pPVar2,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
        }
        bVar4 = 1;
        uVar8 = uVar9 & 0xffffffff;
      }
      else {
        iVar1 = std::__cxx11::string::compare(pcVar7);
        if (iVar1 == 0) {
          bVar10 = local_168 != 0xffffffff;
          local_168 = (uint)uVar9;
          if (bVar10) {
            pPVar2 = (ParserFail *)__cxa_allocate_exception(0x10);
            local_158.states.
            super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)&local_158.states.
                           super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_158,"ERROR: Language has two or more DEDENT tokens\n","");
            ParserFail::ParserFail(pPVar2,(string *)&local_158);
            __cxa_throw(pPVar2,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
          }
        }
        else {
          iVar1 = std::__cxx11::string::compare(pcVar7);
          if (iVar1 == 0) {
            if ((int)local_160 != -1) {
              pPVar2 = (ParserFail *)__cxa_allocate_exception(0x10);
              local_158.states.
              super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&local_158.states.
                             super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_158,"ERROR: Language has two or more NEWLINE tokens\n","")
              ;
              ParserFail::ParserFail(pPVar2,(string *)&local_158);
              __cxa_throw(pPVar2,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
            }
            local_160 = uVar9 & 0xffffffff;
          }
        }
      }
      uVar9 = uVar9 + 1;
      pTVar6 = (language->tokens).
               super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x40;
    } while ((long)uVar9 <
             (long)(int)((ulong)((long)(language->tokens).
                                       super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar6) >>
                        6));
    if ((bVar4 & (int)uVar8 == -1) != 0) {
      pPVar2 = (ParserFail *)__cxa_allocate_exception(0x10);
      local_158.states.
      super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&local_158.states.
                     super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"ERROR: Indentation-sensitive language has no INDENT token\n",
                 "");
      ParserFail::ParserFail(pPVar2,(string *)&local_158);
      __cxa_throw(pPVar2,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if ((local_168 == 0xffffffff & bVar4) == 1) {
      pPVar2 = (ParserFail *)__cxa_allocate_exception(0x10);
      local_158.states.
      super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&local_158.states.
                     super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"ERROR: Indentation-sensitive language has no DEDENT token\n",
                 "");
      ParserFail::ParserFail(pPVar2,(string *)&local_158);
      __cxa_throw(pPVar2,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
    }
    this = (Omega_h *)local_c8;
    if (((int)local_160 == -1 & bVar4) == 1) {
      pPVar2 = (ParserFail *)__cxa_allocate_exception(0x10);
      local_158.states.
      super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&local_158.states.
                     super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"ERROR: Indentation-sensitive language has no NEWLINE token\n"
                 ,"");
      ParserFail::ParserFail(pPVar2,(string *)&local_158);
      __cxa_throw(pPVar2,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  if (((int)local_160 <= (int)uVar8) && ((int)local_160 <= (int)local_168)) {
    build_grammar((Omega_h *)&local_d8,language);
    local_e8.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_d8;
    local_e8.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_d0;
    if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_d0->_M_use_count = local_d0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_d0->_M_use_count = local_d0->_M_use_count + 1;
      }
    }
    build_lalr1_parser(&local_158,&local_e8,false);
    accept_parser(&local_c0,&local_158);
    if (local_158.grammar.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.grammar.
                 super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_158.states2state_configs);
    if (local_158.state_configs.
        super__Vector_base<Omega_h::StateConfig,_std::allocator<Omega_h::StateConfig>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.state_configs.
                      super__Vector_base<Omega_h::StateConfig,_std::allocator<Omega_h::StateConfig>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_158.state_configs.
                            super__Vector_base<Omega_h::StateConfig,_std::allocator<Omega_h::StateConfig>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_158.state_configs.
                            super__Vector_base<Omega_h::StateConfig,_std::allocator<Omega_h::StateConfig>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_158.configs.super__Vector_base<Omega_h::Config,_std::allocator<Omega_h::Config>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.configs.
                      super__Vector_base<Omega_h::Config,_std::allocator<Omega_h::Config>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158.configs.
                            super__Vector_base<Omega_h::Config,_std::allocator<Omega_h::Config>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_158.configs.
                            super__Vector_base<Omega_h::Config,_std::allocator<Omega_h::Config>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
    ::~vector(&local_158.states);
    if (local_e8.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e8.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    __p = (ReaderTables *)operator_new(0xa0);
    (__p->parser).grammar.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_c0.grammar.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (__p->parser).grammar.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         local_c0.grammar.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_c0.grammar.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_c0.grammar.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_c0.grammar.
              super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_c0.grammar.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_c0.grammar.
              super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    std::vector<Omega_h::Action,_std::allocator<Omega_h::Action>_>::vector
              (&(__p->parser).terminal_table.data,&local_c0.terminal_table.data);
    (__p->parser).terminal_table.ncols = local_c0.terminal_table.ncols;
    std::vector<int,_std::allocator<int>_>::vector
              (&(__p->parser).nonterminal_table.data,&local_c0.nonterminal_table.data);
    (__p->parser).nonterminal_table.ncols = local_c0.nonterminal_table.ncols;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&__p->lexer,
               (vector<int,_std::allocator<int>_> *)&local_70);
    (__p->lexer).table.ncols = local_70.table.ncols;
    std::vector<int,_std::allocator<int>_>::vector
              (&(__p->lexer).accepted_tokens,&local_70.accepted_tokens);
    uVar8 = (ulong)bVar4 | uVar8 << 0x20;
    uVar9 = (ulong)local_168 | local_160 << 0x20;
    (__p->lexer).is_deterministic = local_70.is_deterministic;
    (__p->indent_info).is_sensitive = (bool)(char)uVar8;
    *(int3 *)&(__p->indent_info).field_0x1 = (int3)(uVar8 >> 8);
    (__p->indent_info).indent_token = (int)(uVar8 >> 0x20);
    (__p->indent_info).dedent_token = (int)uVar9;
    (__p->indent_info).newline_token = (int)(uVar9 >> 0x20);
    (((element_type *)this)->parser).grammar.
    super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)__p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::ReaderTables*>
              (&(((element_type *)this)->parser).grammar.
                super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               __p);
    _Var3._M_pi = extraout_RDX;
    if (local_c0.nonterminal_table.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0.nonterminal_table.data.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_c0.nonterminal_table.data.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.nonterminal_table.data.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      _Var3._M_pi = extraout_RDX_00;
    }
    if (local_c0.terminal_table.data.
        super__Vector_base<Omega_h::Action,_std::allocator<Omega_h::Action>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0.terminal_table.data.
                      super__Vector_base<Omega_h::Action,_std::allocator<Omega_h::Action>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c0.terminal_table.data.
                            super__Vector_base<Omega_h::Action,_std::allocator<Omega_h::Action>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.terminal_table.data.
                            super__Vector_base<Omega_h::Action,_std::allocator<Omega_h::Action>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      _Var3._M_pi = extraout_RDX_01;
    }
    if (local_c0.grammar.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.grammar.
                 super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      _Var3._M_pi = extraout_RDX_02;
    }
    if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
      _Var3._M_pi = extraout_RDX_03;
    }
    if (local_70.accepted_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.accepted_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_70.accepted_tokens.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.accepted_tokens.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      _Var3._M_pi = extraout_RDX_04;
    }
    if (local_70.table.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.table.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.table.data.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.table.data.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      _Var3._M_pi = extraout_RDX_05;
    }
    RVar11.super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var3._M_pi;
    RVar11.super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (ReaderTablesPtr)
           RVar11.super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>;
  }
  pPVar2 = (ParserFail *)__cxa_allocate_exception(0x10);
  local_158.states.
  super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_158.states.
                 super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"ERROR: NEWLINE needs to come before all other indent tokens\n",""
            );
  ParserFail::ParserFail(pPVar2,(string *)&local_158);
  __cxa_throw(pPVar2,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ReaderTablesPtr build_reader_tables(Language const& language) {
  auto lexer = build_lexer(language);
  auto indent_info = build_indent_info(language);
  auto grammar = build_grammar(language);
  auto parser = accept_parser(build_lalr1_parser(grammar));
  return ReaderTablesPtr(new ReaderTables({parser, lexer, indent_info}));
}